

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec.h
# Opt level: O0

void __thiscall vec<bool>::growTo(vec<bool> *this,uint size)

{
  uint in_ESI;
  uint *in_RDI;
  vec<bool> *unaff_retaddr;
  uint i;
  uint local_10;
  
  if (*in_RDI < in_ESI) {
    reserve(unaff_retaddr,(uint)((ulong)in_RDI >> 0x20));
    for (local_10 = *in_RDI; local_10 < in_ESI; local_10 = local_10 + 1) {
      *(undefined1 *)(*(long *)(in_RDI + 2) + (ulong)local_10) = 0;
    }
    *in_RDI = in_ESI;
  }
  return;
}

Assistant:

void growTo(unsigned int size) {
		if (size <= sz) {
			return;
		}
		reserve(size);
		for (unsigned int i = sz; i < size; i++) {
			new (&data[i]) T();
		}
		sz = size;
	}